

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_nim_has_valid_dims(nifti_image *nim,int complain)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  uint local_34;
  
  uVar6 = nim->dim[0];
  if (uVar6 - 8 < 0xfffffff9) {
    if (complain != 0) {
      fprintf(_stderr,"** NVd: dim[0] (%d) out of range [1,7]\n",(ulong)uVar6);
      return 0;
    }
LAB_001114c5:
    uVar6 = 0;
  }
  else {
    piVar1 = nim->dim;
    uVar3 = 0;
    if (nim->ndim == uVar6) {
LAB_00111323:
      if ((nim->dim[1] != nim->nx) ||
         ((uVar2 = 1, uVar6 != 1 &&
          ((nim->dim[2] != nim->ny ||
           ((uVar2 = 2, 2 < uVar6 &&
            ((nim->dim[3] != nim->nz ||
             ((uVar2 = 3, uVar6 != 3 &&
              ((nim->dim[4] != nim->nt ||
               ((uVar2 = 4, 4 < uVar6 &&
                ((nim->dim[5] != nim->nu ||
                 ((uVar2 = 5, uVar6 != 5 &&
                  ((nim->dim[6] != nim->nv ||
                   ((uVar2 = 6, 6 < uVar6 && (uVar2 = uVar6, nim->dim[7] != nim->nw)))))))))))))))))
            ))))))) {
        if (complain == 0) goto LAB_001114c5;
        uVar3 = uVar3 + 1;
        fprintf(_stderr,
                "** NVd mismatch: dims    = %d,%d,%d,%d,%d,%d,%d\n                 nxyz... = %d,%d,%d,%d,%d,%d,%d\n"
                ,(ulong)(uint)nim->dim[1],(ulong)(uint)nim->dim[2],(ulong)(uint)nim->dim[3],
                (ulong)(uint)nim->dim[4],(ulong)(uint)nim->dim[5],(ulong)(uint)nim->dim[6],
                (ulong)(uint)nim->dim[7],(ulong)(uint)nim->nx,(ulong)(uint)nim->ny,
                (ulong)(uint)nim->nz,(ulong)(uint)nim->nt,(ulong)(uint)nim->nu,(ulong)(uint)nim->nv,
                (ulong)(uint)nim->nw);
        uVar2 = nim->dim[0];
      }
    }
    else {
      if (complain == 0) goto LAB_001114c5;
      fprintf(_stderr,"** NVd: ndim != dim[0] (%d,%d)\n");
      uVar6 = *piVar1;
      uVar3 = 1;
      uVar2 = uVar6;
      if (0 < (int)uVar6) goto LAB_00111323;
    }
    if (2 < g_opts_0) {
      nifti_nim_has_valid_dims_cold_1();
      uVar2 = local_34;
    }
    uVar4 = 1;
    if (0 < (int)uVar2) {
      lVar5 = 0;
      do {
        if ((long)nim->dim[lVar5 + 1] < 1) {
          if (complain == 0) goto LAB_001114c5;
          fprintf(_stderr,"** NVd: dim[%d] (=%d) <= 0\n",(ulong)((int)lVar5 + 1));
          uVar3 = uVar3 + 1;
          uVar2 = *piVar1;
        }
        else {
          uVar4 = uVar4 * (long)nim->dim[lVar5 + 1];
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)uVar2);
    }
    if (uVar4 != nim->nvox) {
      if (complain == 0) goto LAB_001114c5;
      fprintf(_stderr,"** NVd: nvox does not match %d-dim product (%u, %u)\n",(ulong)uVar2,nim->nvox
              ,uVar4 & 0xffffffff);
      uVar3 = uVar3 + 1;
    }
    if (1 < g_opts_0) {
      uVar6 = *piVar1;
      lVar5 = (long)(int)uVar6;
      if (lVar5 < 7) {
        do {
          uVar6 = uVar6 + 1;
          if (1 < (uint)nim->dim[lVar5 + 1]) {
            fprintf(_stderr,"** NVd warning: dim[%d] = %d, but ndim = %d\n",(ulong)uVar6,
                    (ulong)(uint)nim->dim[lVar5 + 1],(ulong)(uint)*piVar1);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 7);
      }
      if (2 < g_opts_0) {
        fprintf(_stderr,"-d nim_has_valid_dims check, errs = %d\n",(ulong)uVar3);
      }
    }
    uVar6 = (uint)((int)uVar3 < 1);
  }
  return uVar6;
}

Assistant:

int nifti_nim_has_valid_dims(nifti_image * nim, int complain)
{
   size_t prod;
   int    c, errs = 0;

   /**- start with dim[0]: failure here is considered terminal */
   if( nim->dim[0] <= 0 || nim->dim[0] > 7 ){
      errs++;
      if( complain )
         fprintf(stderr,"** NVd: dim[0] (%d) out of range [1,7]\n",nim->dim[0]);
      return 0;
   }

   /**- check whether ndim equals dim[0] */
   if( nim->ndim != nim->dim[0] ){
      errs++;
      if( ! complain ) return 0;
      fprintf(stderr,"** NVd: ndim != dim[0] (%d,%d)\n",nim->ndim,nim->dim[0]);
   }

   /**- compare each dim[i] to the proper nx, ny, ... */
   if( ( (nim->dim[0] >= 1) && (nim->dim[1] != nim->nx) ) ||
       ( (nim->dim[0] >= 2) && (nim->dim[2] != nim->ny) ) ||
       ( (nim->dim[0] >= 3) && (nim->dim[3] != nim->nz) ) ||
       ( (nim->dim[0] >= 4) && (nim->dim[4] != nim->nt) ) ||
       ( (nim->dim[0] >= 5) && (nim->dim[5] != nim->nu) ) ||
       ( (nim->dim[0] >= 6) && (nim->dim[6] != nim->nv) ) ||
       ( (nim->dim[0] >= 7) && (nim->dim[7] != nim->nw) )   ){
      errs++;
      if( !complain ) return 0;
      fprintf(stderr,"** NVd mismatch: dims    = %d,%d,%d,%d,%d,%d,%d\n"
                     "                 nxyz... = %d,%d,%d,%d,%d,%d,%d\n",
                     nim->dim[1], nim->dim[2], nim->dim[3],
                     nim->dim[4], nim->dim[5], nim->dim[6], nim->dim[7],
                     nim->nx, nim->ny, nim->nz,
                     nim->nt, nim->nu, nim->nv, nim->nw );
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"-d check dim[%d] =", nim->dim[0]);
      for( c = 0; c < 7; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n', stderr);
   }

   /**- check the dimensions, and that their product matches nvox */
   prod = 1;
   for( c = 1; c <= nim->dim[0]; c++ ){
      if( nim->dim[c] > 0)
         prod *= nim->dim[c];
      else if( nim->dim[c] <= 0 ){
         if( !complain ) return 0;
         fprintf(stderr,"** NVd: dim[%d] (=%d) <= 0\n",c, nim->dim[c]);
         errs++;
      }
   }
   if( prod != nim->nvox ){
      if( ! complain ) return 0;
      fprintf(stderr,"** NVd: nvox does not match %d-dim product (%u, %u)\n",
              nim->dim[0], (unsigned)nim->nvox, (unsigned)prod);
      errs++;
   }

   /**- if debug, warn about any remaining dim that is neither 0, nor 1 */
   /*   (values in dims above dim[0] are undefined, as reminded by Cinly
         Ooi and Alle Meije Wink)                   16 Nov 2005 [rickr] */
   if( g_opts.debug > 1 )
      for( c = nim->dim[0]+1; c <= 7; c++ )
         if( nim->dim[c] != 0 && nim->dim[c] != 1 )
            fprintf(stderr,"** NVd warning: dim[%d] = %d, but ndim = %d\n",
                    c, nim->dim[c], nim->dim[0]);

   if( g_opts.debug > 2 )
      fprintf(stderr,"-d nim_has_valid_dims check, errs = %d\n", errs);

   /**- return invalid or valid */
   if( errs > 0 ) return 0;
   else           return 1;
}